

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Errors::RBDLInvalidParameterError::~RBDLInvalidParameterError
          (RBDLInvalidParameterError *this)

{
  void *in_RDI;
  
  ~RBDLInvalidParameterError((RBDLInvalidParameterError *)0x6da668);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class RBDL_DLLAPI RBDLInvalidParameterError : public RBDLError
{
public:
  RBDLInvalidParameterError(std::string text);
}